

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O0

void verify_large_zip(archive *a,fileblocks *fileblocks)

{
  archive_entry *in_RDI;
  int i;
  archive_entry *ae;
  char namebuff [64];
  char *in_stack_ffffffffffffff78;
  archive_entry *paVar1;
  archive_entry **entry;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  uint in_stack_ffffffffffffff84;
  archive *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  wchar_t line;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar3;
  undefined4 local_60;
  wchar_t in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  archive_vtable_conflict *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc8;
  
  archive_read_set_options
            ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fd0a,in_stack_ffffffffffffffb0);
  archive_read_set_open_callback
            (in_stack_ffffffffffffff88,
             (undefined1 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fd50,in_stack_ffffffffffffffb0);
  archive_read_set_read_callback
            (in_stack_ffffffffffffff88,
             (archive_read_callback *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fd96,in_stack_ffffffffffffffb0);
  archive_read_set_skip_callback
            (in_stack_ffffffffffffff88,
             (archive_skip_callback *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fddc,in_stack_ffffffffffffffb0);
  archive_read_set_seek_callback
            (in_stack_ffffffffffffff88,
             (archive_seek_callback *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  paVar1 = in_RDI;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fe22,in_stack_ffffffffffffffb0);
  archive_read_set_callback_data
            ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),paVar1);
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fe66,in_stack_ffffffffffffffb0);
  archive_read_open1((archive *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  paVar1 = in_RDI;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x21fea5,in_stack_ffffffffffffffb0);
  for (uVar3 = 0; 0 < test_sizes[(int)uVar3]; uVar3 = uVar3 + 1) {
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (archive_entry **)paVar1);
    paVar1 = in_RDI;
    assertion_equal_int((char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)in_RDI,(char *)0x21ff08,in_stack_ffffffffffffffb0);
    sprintf(&stack0xffffffffffffffa8,"file_%d",(ulong)uVar3);
    in_stack_ffffffffffffff88 = (archive *)&stack0xffffffffffffffa8;
    archive_entry_pathname(paVar1);
    in_stack_ffffffffffffff80 = 0;
    assertion_equal_string
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               (char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
               (char *)in_stack_ffffffffffffff88,(char *)((ulong)in_stack_ffffffffffffff84 << 0x20),
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffff90 = (char *)test_sizes[(int)uVar3];
    archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffa4,local_60));
    paVar1 = (archive_entry *)0x0;
    assertion_equal_int((char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),
                        (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x21ffbe,in_stack_ffffffffffffffb0);
  }
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (archive_entry **)paVar1);
  paVar1 = in_RDI;
  assertion_equal_int((char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),
                      (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (longlong)in_RDI,(char *)0x220012,in_stack_ffffffffffffffb0);
  archive_entry_pathname(paVar1);
  entry = (archive_entry **)0x0;
  uVar2 = 0;
  assertion_equal_string
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
             (char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
             (char *)in_stack_ffffffffffffff88,(char *)((ulong)in_stack_ffffffffffffff84 << 0x20),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  line = (wchar_t)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffff84,uVar2),entry);
  assertion_equal_int((char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),line,
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,uVar2),(longlong)in_RDI,
                      (char *)0x22009e,in_stack_ffffffffffffffb0);
  archive_read_close((archive *)0x2200ab);
  assertion_equal_int((char *)CONCAT44(uVar3,in_stack_ffffffffffffff98),line,
                      (longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,uVar2),(longlong)in_RDI,
                      (char *)0x2200dd,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void
verify_large_zip(struct archive *a, struct fileblocks *fileblocks)
{
	char namebuff[64];
	struct archive_entry *ae;
	int i;

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "zip:ignorecrc32"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_open_callback(a, memory_read_open));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_read_callback(a, memory_read));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_skip_callback(a, memory_read_skip));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_seek_callback(a, memory_read_seek));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_callback_data(a, fileblocks));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open1(a));

	/*
	 * Read entries back.
	 */
	for (i = 0; test_sizes[i] > 0; i++) {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		sprintf(namebuff, "file_%d", i);
		assertEqualString(namebuff, archive_entry_pathname(ae));
		assertEqualInt(test_sizes[i], archive_entry_size(ae));
	}
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("lastfile", archive_entry_pathname(ae));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
}